

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSim.c
# Opt level: O3

Vec_Int_t *
Saig_ManProcessCex(Aig_Man_t *p,int iFirstFlopPi,Abc_Cex_t *pCex,Vec_Ptr_t *vSimInfo,int fVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  Vec_Int_t *vRes;
  ulong uVar6;
  int iVar7;
  Vec_Int_t *p_00;
  
  if (1 < vSimInfo->nSize) {
    uVar3 = pCex->iFrame * 2 + 2;
    if ((long)vSimInfo->pArray[1] - (long)*vSimInfo->pArray >> 2 <
        (long)(int)((((int)uVar3 >> 5) + 1) - (uint)((uVar3 & 0x1e) == 0))) {
      __assert_fail("(unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1))"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x18a,
                    "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)"
                   );
    }
    iVar2 = Saig_ManSimDataInit2(p,pCex,vSimInfo);
    if (iVar2 != 1) {
      __assert_fail("Value == SAIG_ONE_NEW",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                    ,0x18d,
                    "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)"
                   );
    }
    if (0 < p->nRegs) {
      iVar2 = 0;
      do {
        uVar3 = p->nTruePis + iVar2;
        if (((int)uVar3 < 0) || (p->vCis->nSize <= (int)uVar3)) goto LAB_00617f85;
        Saig_ManSetAndDriveImplications_rec
                  (p,(Aig_Obj_t *)p->vCis->pArray[uVar3],0,pCex->iFrame,vSimInfo);
        iVar2 = iVar2 + 1;
      } while (iVar2 < p->nRegs);
    }
    if (-1 < pCex->iFrame) {
      iVar2 = pCex->iFrame;
      do {
        Saig_ManSetAndDriveImplications_rec(p,p->pConst1,iVar2,pCex->iFrame,vSimInfo);
        if (0 < iFirstFlopPi) {
          uVar6 = 0;
          do {
            if ((long)p->vCis->nSize <= (long)uVar6) goto LAB_00617f85;
            Saig_ManSetAndDriveImplications_rec
                      (p,(Aig_Obj_t *)p->vCis->pArray[uVar6],iVar2,pCex->iFrame,vSimInfo);
            uVar6 = uVar6 + 1;
          } while ((uint)iFirstFlopPi != uVar6);
        }
        bVar1 = 0 < iVar2;
        iVar2 = iVar2 + -1;
      } while (bVar1);
    }
    iVar2 = pCex->iPo;
    if ((-1 < (long)iVar2) && (iVar2 < p->vCos->nSize)) {
      Saig_ManExplorePaths_rec
                (p,(Aig_Obj_t *)p->vCos->pArray[iVar2],pCex->iFrame,pCex->iFrame,vSimInfo);
      pVVar4 = (Vec_Int_t *)malloc(0x10);
      pVVar4->nCap = 1000;
      pVVar4->nSize = 0;
      piVar5 = (int *)malloc(4000);
      pVVar4->pArray = piVar5;
      vRes = (Vec_Int_t *)malloc(0x10);
      vRes->nCap = 1000;
      vRes->nSize = 0;
      piVar5 = (int *)malloc(4000);
      vRes->pArray = piVar5;
      if (iFirstFlopPi < p->nTruePis) {
        do {
          uVar3 = pCex->iFrame;
          p_00 = vRes;
          if (-1 < (int)uVar3) {
            if ((iFirstFlopPi < 0) || (p->vCis->nSize <= iFirstFlopPi)) goto LAB_00617f85;
            iVar2 = *(int *)((long)p->vCis->pArray[(uint)iFirstFlopPi] + 0x24);
            if (((long)iVar2 < 0) || (vSimInfo->nSize <= iVar2)) goto LAB_00617f85;
            iVar7 = uVar3 * 2;
            do {
              p_00 = pVVar4;
              if ((*(uint *)((long)vSimInfo->pArray[iVar2] + (ulong)(uVar3 >> 4) * 4) >>
                   ((byte)iVar7 & 0x1e) & 2) != 0) break;
              iVar7 = iVar7 + -2;
              bVar1 = 0 < (int)uVar3;
              p_00 = vRes;
              uVar3 = uVar3 - 1;
            } while (bVar1);
          }
          Vec_IntPush(p_00,iFirstFlopPi);
          iFirstFlopPi = iFirstFlopPi + 1;
        } while (iFirstFlopPi < p->nTruePis);
      }
      iVar2 = Saig_ManSimDataInit(p,pCex,vSimInfo,vRes);
      if (iVar2 != 2) {
        __assert_fail("Value == SAIG_ONE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldSim.c"
                      ,0x1ab,
                      "Vec_Int_t *Saig_ManProcessCex(Aig_Man_t *, int, Abc_Cex_t *, Vec_Ptr_t *, int)"
                     );
      }
      if (vRes->pArray != (int *)0x0) {
        free(vRes->pArray);
      }
      free(vRes);
      return pVVar4;
    }
  }
LAB_00617f85:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Vec_Int_t * Saig_ManProcessCex( Aig_Man_t * p, int iFirstFlopPi, Abc_Cex_t * pCex, Vec_Ptr_t * vSimInfo, int fVerbose )
{
    Aig_Obj_t * pObj;
    Vec_Int_t * vRes, * vResInv;
    int i, f, Value;
//    assert( Aig_ManRegNum(p) > 0 );
    assert( (unsigned *)Vec_PtrEntry(vSimInfo,1) - (unsigned *)Vec_PtrEntry(vSimInfo,0) >= Abc_BitWordNum(2*(pCex->iFrame+1)) );
    // start simulation data
    Value = Saig_ManSimDataInit2( p, pCex, vSimInfo );
    assert( Value == SAIG_ONE_NEW );
    // derive implications of constants and primary inputs
    Saig_ManForEachLo( p, pObj, i )
        Saig_ManSetAndDriveImplications_rec( p, pObj, 0, pCex->iFrame, vSimInfo );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        Saig_ManSetAndDriveImplications_rec( p, Aig_ManConst1(p), f, pCex->iFrame, vSimInfo );
        for ( i = 0; i < iFirstFlopPi; i++ )
            Saig_ManSetAndDriveImplications_rec( p, Aig_ManCi(p, i), f, pCex->iFrame, vSimInfo );
    }
    // recursively compute justification
    Saig_ManExplorePaths_rec( p, Aig_ManCo(p, pCex->iPo), pCex->iFrame, pCex->iFrame, vSimInfo );
    // select the result
    vRes = Vec_IntAlloc( 1000 );
    vResInv = Vec_IntAlloc( 1000 );
    for ( i = iFirstFlopPi; i < Saig_ManPiNum(p); i++ )
    {
        for ( f = pCex->iFrame; f >= 0; f-- )
        {
            Value = Saig_ManSimInfo2Get( vSimInfo, Aig_ManCi(p, i), f );
            if ( Saig_ManSimInfo2IsOld( Value ) )
                break;
        }
        if ( f >= 0 )
            Vec_IntPush( vRes, i );
        else
            Vec_IntPush( vResInv, i );
    }
    // resimulate to make sure it is valid
    Value = Saig_ManSimDataInit( p, pCex, vSimInfo, vResInv );
    assert( Value == SAIG_ONE );
    Vec_IntFree( vResInv );
    return vRes;
}